

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

void * __thiscall ChunkedStackPool<4092>::Allocate(ChunkedStackPool<4092> *this,uint bytes)

{
  uint uVar1;
  StackChunk *pSVar2;
  uint bytes_local;
  ChunkedStackPool<4092> *this_local;
  
  uVar1 = bytes + 7 & 0xfffffff8;
  if (uVar1 < 0xffd) {
    if (this->size + uVar1 < 0xffd) {
      this->size = uVar1 + this->size;
      this_local = (ChunkedStackPool<4092> *)
                   ((long)this->curr + (((ulong)this->size + 8) - (ulong)uVar1));
    }
    else if ((this->curr == (StackChunk *)0x0) || (this->curr->next == (StackChunk *)0x0)) {
      if (this->curr == (StackChunk *)0x0) {
        pSVar2 = (StackChunk *)(*(code *)NULLC::alloc)(0x1008);
        this->first = pSVar2;
        this->curr = pSVar2;
        this->curr->next = (StackChunk *)0x0;
      }
      else {
        pSVar2 = (StackChunk *)(*(code *)NULLC::alloc)(0x1008);
        this->curr->next = pSVar2;
        this->curr = this->curr->next;
        this->curr->next = (StackChunk *)0x0;
      }
      this->size = uVar1;
      this_local = (ChunkedStackPool<4092> *)this->curr->data;
    }
    else {
      this->curr = this->curr->next;
      this->size = uVar1;
      this_local = (ChunkedStackPool<4092> *)this->curr->data;
    }
    return this_local;
  }
  __assert_fail("bytes <= chunkSize",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Pool.h",
                0x37,"void *ChunkedStackPool<4092>::Allocate(unsigned int) [chunkSize = 4092]");
}

Assistant:

void*	Allocate(unsigned int bytes)
	{
		bytes = (bytes + 7) & ~7; // 8-byte align

		assert(bytes <= chunkSize);
		if(size + bytes <= chunkSize)
		{
			size += bytes;
			return curr->data + size - bytes;
		}
		if(curr && curr->next)
		{
			curr = curr->next;
			size = bytes;
			return curr->data;
		}
		if(curr)
		{
			curr->next = new(NULLC::alloc(sizeof(StackChunk))) StackChunk;
			curr = curr->next;
			curr->next = NULL;
		}else{
			curr = first = new(NULLC::alloc(sizeof(StackChunk))) StackChunk;
			curr->next = NULL;
		}
		size = bytes;
		return curr->data;
	}